

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhCellWriteOvflPayload(lhcell *pCell,void *pKey,sxu32 nKeylen,...)

{
  lhpage *plVar1;
  lhash_kv_engine *pEngine;
  sxu64 sVar2;
  unqlite_page *puVar3;
  unqlite_page *puVar4;
  lhcell *plVar5;
  char in_AL;
  int iVar6;
  uint uVar7;
  unqlite_page **ppuVar8;
  undefined8 in_RCX;
  ulong uVar9;
  void *pvVar10;
  unqlite_page *puVar11;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar12;
  unqlite_page *puVar13;
  uchar *puVar14;
  uchar *puVar15;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  unqlite_page *pNew;
  va_list ap;
  unqlite_page *local_128;
  unqlite_page *local_120;
  ulong local_118;
  unqlite_page **local_110;
  undefined1 *local_108;
  unqlite_page *local_100;
  unqlite_page *local_f8;
  lhcell *local_f0;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  plVar1 = pCell->pPage;
  pEngine = plVar1->pHash;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar6 = lhAcquirePage(pEngine,&local_128);
  if ((iVar6 != 0) || (iVar6 = (*pEngine->pIo->xWrite)(local_128), iVar6 != 0)) {
    return iVar6;
  }
  sVar2 = local_128->iPage;
  pCell->iOvfl = sVar2;
  local_f0 = pCell;
  SyBigEndianPack64(plVar1->pRaw->zData + (ulong)pCell->iStart + 0x12,sVar2);
  puVar14 = local_128->zData;
  puVar14[0] = '\0';
  puVar14[1] = '\0';
  puVar14[2] = '\0';
  puVar14[3] = '\0';
  puVar14[4] = '\0';
  puVar14[5] = '\0';
  puVar14[6] = '\0';
  puVar14[7] = '\0';
  pvVar10 = (void *)((ulong)nKeylen + (long)pKey);
  puVar14 = local_128->zData + 0x12;
  puVar15 = local_128->zData + pEngine->iPageSize;
  local_120 = local_128;
  local_f8 = local_128;
  local_100 = local_128;
  for (; plVar5 = local_f0, puVar13 = local_f8, pKey < pvVar10;
      pKey = (void *)((long)pKey + (ulong)uVar12)) {
    if (puVar15 <= puVar14) {
      iVar6 = lhAcquirePage(pEngine,&local_120);
      puVar13 = local_120;
      if (iVar6 != 0) {
        return iVar6;
      }
      iVar6 = (*pEngine->pIo->xWrite)(local_120);
      puVar11 = local_100;
      if (iVar6 != 0) {
        return iVar6;
      }
      SyBigEndianPack64(local_100->zData,puVar13->iPage);
      (*pEngine->pIo->xPageUnref)(puVar11);
      puVar14 = puVar13->zData;
      puVar14[0] = '\0';
      puVar14[1] = '\0';
      puVar14[2] = '\0';
      puVar14[3] = '\0';
      puVar14[4] = '\0';
      puVar14[5] = '\0';
      puVar14[6] = '\0';
      puVar14[7] = '\0';
      puVar14 = puVar13->zData + 8;
      puVar15 = puVar13->zData + pEngine->iPageSize;
      local_100 = puVar13;
    }
    uVar7 = (int)puVar15 - (int)puVar14;
    uVar12 = (int)pvVar10 - (int)pKey;
    if (uVar7 <= uVar12) {
      uVar12 = uVar7;
    }
    SyMemcpy(pKey,puVar14,uVar12);
    puVar14 = puVar14 + uVar12;
  }
  local_128 = local_100;
  local_118 = 0x3000000018;
  local_110 = &pNew;
  local_108 = local_e8;
  sVar2 = local_100->iPage;
  local_f0->iDataPage = sVar2;
  local_f0->iDataOfft = (short)puVar14 - (short)*(undefined4 *)&local_100->zData;
  SyBigEndianPack64(local_f8->zData + 8,sVar2);
  *(sxu16 *)(puVar13->zData + 0x10) = plVar5->iDataOfft << 8 | plVar5->iDataOfft >> 8;
  do {
    uVar12 = (uint)local_118;
    uVar9 = local_118 & 0xffffffff;
    if (uVar9 < 0x29) {
      local_118 = CONCAT44(local_118._4_4_,(int)(uVar9 + 8));
      puVar13 = *(unqlite_page **)(local_108 + uVar9);
      if (0x20 < uVar12) goto LAB_00113465;
      local_118 = CONCAT44(local_118._4_4_,uVar12 + 0x10);
      ppuVar8 = (unqlite_page **)(local_108 + uVar9 + 8);
    }
    else {
      puVar13 = *local_110;
      local_110 = local_110 + 1;
LAB_00113465:
      ppuVar8 = local_110;
      local_110 = local_110 + 1;
    }
    if (puVar13 == (unqlite_page *)0x0) {
      (*pEngine->pIo->xPageUnref)(local_128);
      return 0;
    }
    puVar11 = (unqlite_page *)((long)&puVar13->zData + (long)&(*ppuVar8)->zData);
    for (; puVar13 < puVar11; puVar13 = (unqlite_page *)((long)&puVar13->zData + (ulong)uVar12)) {
      if (puVar15 <= puVar14) {
        iVar6 = lhAcquirePage(pEngine,&local_120);
        puVar4 = local_120;
        if (iVar6 != 0) {
          return iVar6;
        }
        iVar6 = (*pEngine->pIo->xWrite)(local_120);
        puVar3 = local_128;
        if (iVar6 != 0) {
          return iVar6;
        }
        SyBigEndianPack64(local_128->zData,puVar4->iPage);
        (*pEngine->pIo->xPageUnref)(puVar3);
        puVar14 = puVar4->zData;
        puVar14[0] = '\0';
        puVar14[1] = '\0';
        puVar14[2] = '\0';
        puVar14[3] = '\0';
        puVar14[4] = '\0';
        puVar14[5] = '\0';
        puVar14[6] = '\0';
        puVar14[7] = '\0';
        local_128 = puVar4;
        puVar14 = puVar4->zData + 8;
        puVar15 = puVar4->zData + pEngine->iPageSize;
      }
      uVar7 = (int)puVar15 - (int)puVar14;
      uVar12 = (int)puVar11 - (int)puVar13;
      if (uVar7 <= uVar12) {
        uVar12 = uVar7;
      }
      SyMemcpy(puVar13,puVar14,uVar12);
      puVar14 = puVar14 + uVar12;
    }
  } while( true );
}

Assistant:

static int lhCellWriteOvflPayload(lhcell *pCell,const void *pKey,sxu32 nKeylen,...)
{
	lhpage *pPage = pCell->pPage;
	lhash_kv_engine *pEngine = pPage->pHash;
	unqlite_page *pOvfl,*pFirst,*pNew;
	const unsigned char *zPtr,*zEnd;
	unsigned char *zRaw,*zRawEnd;
	sxu32 nAvail;
	va_list ap;
	int rc;
	/* Acquire a new overflow page */
	rc = lhAcquirePage(pEngine,&pOvfl);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Acquire a writer lock */
	rc = pEngine->pIo->xWrite(pOvfl);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	pFirst = pOvfl;
	/* Link */
	pCell->iOvfl = pOvfl->iPage;
	/* Update the cell header */
	SyBigEndianPack64(&pPage->pRaw->zData[pCell->iStart + 4/*Hash*/ + 4/*Key*/ + 8/*Data*/ + 2 /*Next cell*/],pCell->iOvfl);
	/* Start the write process */
	zPtr = (const unsigned char *)pKey;
	zEnd = &zPtr[nKeylen];
	SyBigEndianPack64(pOvfl->zData,0); /* Next overflow page on the chain */
	zRaw = &pOvfl->zData[8/* Next ovfl page*/ + 8 /* Data page */ + 2 /* Data offset*/];
	zRawEnd = &pOvfl->zData[pEngine->iPageSize];
	pNew = pOvfl;
	/* Write the key */
	for(;;){
		if( zPtr >= zEnd ){
			break;
		}
		if( zRaw >= zRawEnd ){
			/* Acquire a new page */
			rc = lhAcquirePage(pEngine,&pNew);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			rc = pEngine->pIo->xWrite(pNew);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Link */
			SyBigEndianPack64(pOvfl->zData,pNew->iPage);
			pEngine->pIo->xPageUnref(pOvfl);
			SyBigEndianPack64(pNew->zData,0); /* Next overflow page on the chain */
			pOvfl = pNew;
			zRaw = &pNew->zData[8];
			zRawEnd = &pNew->zData[pEngine->iPageSize];
		}
		nAvail = (sxu32)(zRawEnd-zRaw);
		nKeylen = (sxu32)(zEnd-zPtr);
		if( nKeylen > nAvail ){
			nKeylen = nAvail;
		}
		SyMemcpy((const void *)zPtr,(void *)zRaw,nKeylen);
		/* Synchronize pointers */
		zPtr += nKeylen;
		zRaw += nKeylen;
	}
	rc = UNQLITE_OK;
	va_start(ap,nKeylen);
	pCell->iDataPage = pNew->iPage;
	pCell->iDataOfft = (sxu16)(zRaw-pNew->zData);
	/* Write the data page and its offset */
	SyBigEndianPack64(&pFirst->zData[8/*Next ovfl*/],pCell->iDataPage);
	SyBigEndianPack16(&pFirst->zData[8/*Next ovfl*/+8/*Data page*/],pCell->iDataOfft);
	/* Write data */
	for(;;){
		const void *pData;
		sxu32 nDatalen;
		sxu64 nData;
		pData = va_arg(ap,const void *);
		nData = va_arg(ap,sxu64);
		if( pData == 0 ){
			/* No more chunks */
			break;
		}
		/* Write this chunk */
		zPtr = (const unsigned char *)pData;
		zEnd = &zPtr[nData];
		for(;;){
			if( zPtr >= zEnd ){
				break;
			}
			if( zRaw >= zRawEnd ){
				/* Acquire a new page */
				rc = lhAcquirePage(pEngine,&pNew);
				if( rc != UNQLITE_OK ){
					va_end(ap);
					return rc;
				}
				rc = pEngine->pIo->xWrite(pNew);
				if( rc != UNQLITE_OK ){
					va_end(ap);
					return rc;
				}
				/* Link */
				SyBigEndianPack64(pOvfl->zData,pNew->iPage);
				pEngine->pIo->xPageUnref(pOvfl);
				SyBigEndianPack64(pNew->zData,0); /* Next overflow page on the chain */
				pOvfl = pNew;
				zRaw = &pNew->zData[8];
				zRawEnd = &pNew->zData[pEngine->iPageSize];
			}
			nAvail = (sxu32)(zRawEnd-zRaw);
			nDatalen = (sxu32)(zEnd-zPtr);
			if( nDatalen > nAvail ){
				nDatalen = nAvail;
			}
			SyMemcpy((const void *)zPtr,(void *)zRaw,nDatalen);
			/* Synchronize pointers */
			zPtr += nDatalen;
			zRaw += nDatalen;
		}
	}
	/* Unref the overflow page */
	pEngine->pIo->xPageUnref(pOvfl);
	va_end(ap);
	return UNQLITE_OK;
}